

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_parser.hpp
# Opt level: O2

void __thiscall
jsoncons::basic_json_parser<wchar_t,_std::allocator<char>_>::end_object
          (basic_json_parser<wchar_t,_std::allocator<char>_> *this,
          basic_json_visitor<wchar_t> *visitor,error_code *ec)

{
  json_errc __args;
  parse_state pVar1;
  byte bVar2;
  int iVar3;
  
  if (0 < this->level_) {
    pVar1 = pop_state(this);
    this->state_ = pVar1;
    if (pVar1 == array) {
      __args = expected_comma_or_rbracket;
      goto LAB_0032efda;
    }
    if (pVar1 == object) {
      (*visitor->_vptr_basic_json_visitor[5])(visitor,this,ec);
      bVar2 = this->cursor_mode_ ^ 1;
      if (this->level_ == this->mark_level_) {
        bVar2 = false;
      }
      this->more_ = (bool)bVar2;
      iVar3 = this->level_ + -1;
      this->level_ = iVar3;
      if (iVar3 != 0) {
        this->state_ = expect_comma_or_end;
        return;
      }
      this->state_ = accept;
      return;
    }
  }
  __args = unexpected_rbrace;
LAB_0032efda:
  std::function<bool_(jsoncons::json_errc,_const_jsoncons::ser_context_&)>::operator()
            (&this->err_handler_,__args,&this->super_ser_context);
  std::error_code::operator=(ec,__args);
  this->more_ = false;
  return;
}

Assistant:

void end_object(basic_json_visitor<char_type>& visitor, std::error_code& ec)
    {
        if (JSONCONS_UNLIKELY(level_ < 1))
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }
        state_ = pop_state();
        if (state_ == parse_state::object)
        {
            visitor.end_object(*this, ec);
        }
        else if (state_ == parse_state::array)
        {
            err_handler_(json_errc::expected_comma_or_rbracket, *this);
            ec = json_errc::expected_comma_or_rbracket;
            more_ = false;
            return;
        }
        else
        {
            err_handler_(json_errc::unexpected_rbrace, *this);
            ec = json_errc::unexpected_rbrace;
            more_ = false;
            return;
        }

        more_ = !cursor_mode_;
        if (level_ == mark_level_)
        {
            more_ = false;
        }
        --level_;
        if (level_ == 0)
        {
            state_ = parse_state::accept;
        }
        else
        {
            state_ = parse_state::expect_comma_or_end;
        }
    }